

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall
TApp_OneStringEqualVersion_Test::TApp_OneStringEqualVersion_Test
          (TApp_OneStringEqualVersion_Test *this)

{
  TApp_OneStringEqualVersion_Test *this_local;
  
  TApp::TApp(&this->super_TApp);
  (this->super_TApp).super_Test._vptr_Test =
       (_func_int **)&PTR__TApp_OneStringEqualVersion_Test_00215d08;
  return;
}

Assistant:

TEST_F(TApp, OneStringEqualVersion) {
    std::string str;
    app.add_option("-s,--string", str);
    args = {"--string=mystring"};
    run();
    EXPECT_EQ((size_t)1, app.count("-s"));
    EXPECT_EQ((size_t)1, app.count("--string"));
    EXPECT_EQ(str, "mystring");
}